

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  cmMakefile *this;
  pointer ppTVar1;
  TargetPropertyEntry *pTVar2;
  cmLocalGenerator *this_00;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  pointer ppTVar8;
  undefined4 extraout_var;
  cmSourceFile *this_01;
  string *psVar9;
  cmake *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  string *sourceName;
  pointer pbVar13;
  __ireturn_type _Var14;
  byte local_2a9;
  allocator<char> local_2a1;
  cmGeneratorTarget *local_2a0;
  TargetPropertyEntry *local_298;
  string *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  string e;
  cmListFileBacktrace local_218;
  string local_208;
  string fullPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string usedSources;
  
  this = tgt->Target->Makefile;
  ppTVar8 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppTVar1 = (entries->
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = 0;
  local_2a0 = tgt;
  do {
    pcVar3 = local_2a0;
    if (ppTVar8 == ppTVar1) {
LAB_0021e8af:
      return (bool)(bVar6 & 1);
    }
    pTVar2 = *ppTVar8;
    local_290 = cmLinkItem::AsStr_abi_cxx11_(&pTVar2->LinkImplItem->super_cmLinkItem);
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    entrySources.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
    usedSources._M_string_length = 0;
    usedSources.field_2._M_local_buf[0] = '\0';
    local_298 = pTVar2;
    iVar7 = (*pTVar2->_vptr_TargetPropertyEntry[2])
                      (pTVar2,pcVar3->LocalGenerator,config,0,pcVar3,pcVar3,dagChecker,&usedSources)
    ;
    cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar7),&entrySources,false);
    std::__cxx11::string::~string((string *)&usedSources);
    iVar7 = (*local_298->_vptr_TargetPropertyEntry[6])();
    pbVar13 = entrySources.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sourceName = entrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    if ((char)iVar7 != '\0') {
      bVar6 = 1;
    }
    while( true ) {
      pbVar4 = entrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (sourceName == pbVar13) break;
      this_01 = cmMakefile::GetOrCreateSource(this,sourceName,false,Ambiguous);
      e._M_dataplus._M_p = (pointer)&e.field_2;
      e._M_string_length = 0;
      e.field_2._M_local_buf[0] = '\0';
      psVar9 = cmSourceFile::GetFullPath(this_01,&e);
      std::__cxx11::string::string((string *)&fullPath,(string *)psVar9);
      if (fullPath._M_string_length == 0) {
        if (e._M_string_length != 0) {
          pcVar10 = cmLocalGenerator::GetCMakeInstance(local_2a0->LocalGenerator);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
          cmake::IssueMessage(pcVar10,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&usedSources._M_string_length);
        }
LAB_0021e6a0:
        bVar5 = false;
        local_2a9 = bVar6;
      }
      else {
        if ((local_290->_M_string_length != 0) &&
           (bVar5 = cmsys::SystemTools::FileIsFullPath(sourceName), !bVar5)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
          if (local_290->_M_string_length == 0) {
            poVar11 = std::operator<<((ostream *)&usedSources,
                                      "Found relative path while evaluating sources of \"");
            poVar11 = std::operator<<(poVar11,(string *)&local_2a0->Target->Name);
            poVar11 = std::operator<<(poVar11,"\":\n  \"");
            poVar11 = std::operator<<(poVar11,(string *)sourceName);
            pcVar12 = "\"\n";
          }
          else {
            poVar11 = std::operator<<((ostream *)&usedSources,"Target \"");
            poVar11 = std::operator<<(poVar11,(string *)local_290);
            poVar11 = std::operator<<(poVar11,
                                      "\" contains relative path in its INTERFACE_SOURCES:\n  \"");
            poVar11 = std::operator<<(poVar11,(string *)sourceName);
            pcVar12 = "\"";
          }
          std::operator<<(poVar11,pcVar12);
          this_00 = local_2a0->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
          goto LAB_0021e6a0;
        }
        bVar5 = true;
        std::__cxx11::string::_M_assign((string *)sourceName);
      }
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&e);
      sourceName = sourceName + 1;
      if (!bVar5) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&entrySources);
        bVar6 = local_2a9;
        goto LAB_0021e8af;
      }
    }
    usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
    usedSources._M_string_length = 0;
    usedSources.field_2._M_local_buf[0] = '\0';
    for (pbVar13 = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar4;
        pbVar13 = pbVar13 + 1) {
      _Var14 = std::__detail::
               _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)uniqueSrcs,pbVar13);
      if (((undefined1  [16])_Var14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*local_298->_vptr_TargetPropertyEntry[4])(&e);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs
                   ,pbVar13,(cmListFileBacktrace *)&e);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&e._M_string_length);
        if (debugSources) {
          std::operator+(&fullPath," * ",pbVar13);
          std::operator+(&e,&fullPath,"\n");
          std::__cxx11::string::append((string *)&usedSources);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)&fullPath);
        }
      }
    }
    if (usedSources._M_string_length != 0) {
      pcVar10 = cmLocalGenerator::GetCMakeInstance(local_2a0->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Used sources for target ",&local_2a1);
      std::operator+(&local_208,&local_1c8,&local_2a0->Target->Name);
      std::operator+(&fullPath,&local_208,":\n");
      std::operator+(&e,&fullPath,&usedSources);
      (*local_298->_vptr_TargetPropertyEntry[4])(&local_218);
      cmake::IssueMessage(pcVar10,LOG,&e,&local_218);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_218.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&fullPath);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    std::__cxx11::string::~string((string *)&usedSources);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&entrySources);
    ppTVar8 = ppTVar8 + 1;
  } while( true );
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& srcs,
  std::unordered_set<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt, tgt,
                                                      dagChecker),
                                      entrySources);

    if (entry->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::string& src : entrySources) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entrySources) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry->GetBacktrace());
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry->GetBacktrace());
    }
  }
  return contextDependent;
}